

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astPragmaNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t slotCount;
  bool bVar5;
  anon_struct_72_9_6444e132 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_a8;
  sysbvm_tuple_t sStack_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  ulong local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  sStack_90 = 0;
  local_a8 = 0;
  sStack_a0 = 0;
  slotCount = 0;
  local_68 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 9;
  puStack_30 = (undefined1 *)&local_a8;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_a8 = sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  *(sysbvm_tuple_t *)(local_a8 + 0x18) = sVar3;
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(local_a8 + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  sStack_a0 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                        (context,*(sysbvm_tuple_t *)(local_a8 + 0x28),(context->roots).symbolType,
                         arguments[1]);
  _Var2 = sysbvm_astNode_isLiteralNode(context,sStack_a0);
  uVar1 = *(ulong *)(local_a8 + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  local_88 = sysbvm_array_create(context,slotCount);
  if (slotCount != 0) {
    sVar3 = 0;
    do {
      uVar1 = *(ulong *)(local_a8 + 0x30);
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_98 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8);
      }
      else {
        local_98 = 0;
      }
      sStack_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                            (context,local_98,0,arguments[1]);
      bVar5 = _Var2 != false;
      _Var2 = false;
      if (bVar5) {
        _Var2 = sysbvm_astNode_isLiteralNode(context,sStack_90);
      }
      if ((local_88 & 0xf) == 0 && local_88 != 0) {
        *(sysbvm_tuple_t *)(local_88 + 0x10 + sVar3 * 8) = sStack_90;
      }
      sVar3 = sVar3 + 1;
    } while (slotCount != sVar3);
  }
  if (_Var2 == false) {
    *(sysbvm_tuple_t *)(local_a8 + 0x30) = local_88;
    *(sysbvm_tuple_t *)(local_a8 + 0x20) = (context->roots).pragmaType;
    sysbvm_stackFrame_popRecord(&local_60);
    sysbvm_stackFrame_popRecord(&local_48);
    local_68 = local_a8;
  }
  else {
    sStack_80 = sysbvm_astLiteralNode_getValue(sStack_a0);
    local_78 = sysbvm_array_create(context,slotCount);
    if (slotCount != 0) {
      sVar3 = 0;
      do {
        uVar1 = local_78;
        if ((local_88 & 0xf) == 0 && local_88 != 0) {
          sVar4 = *(sysbvm_tuple_t *)(local_88 + 0x10 + sVar3 * 8);
        }
        else {
          sVar4 = 0;
        }
        sVar4 = sysbvm_astLiteralNode_getValue(sVar4);
        if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
          *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar3 * 8) = sVar4;
        }
        sVar3 = sVar3 + 1;
      } while (slotCount != sVar3);
    }
    sStack_70 = sysbvm_pragma_create(context,sStack_80,local_78);
    local_68 = sysbvm_astLiteralNode_create(context,*(sysbvm_tuple_t *)(local_a8 + 0x10),sStack_70);
    sysbvm_analysisEnvironment_addPragma(context,arguments[1],sStack_70);
    sysbvm_stackFrame_popRecord(&local_60);
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return local_68;
}

Assistant:

static sysbvm_tuple_t sysbvm_astPragmaNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astPragmaNode_t *pragmaNode;
        sysbvm_tuple_t analyzedSelector;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;

        sysbvm_tuple_t literalPragmaSelector;
        sysbvm_tuple_t literalPragmaArguments;
        sysbvm_tuple_t literalPragma;
        sysbvm_tuple_t literalPragmaNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.pragmaNode = (sysbvm_astPragmaNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.pragmaNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.pragmaNode->super.sourcePosition);

    gcFrame.analyzedSelector = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.pragmaNode->selector, context->roots.symbolType, *environment);
    bool isLiteral = sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedSelector);

    size_t pragmaArgumentCount = sysbvm_array_getSize(gcFrame.pragmaNode->arguments);
    gcFrame.analyzedArguments = sysbvm_array_create(context, pragmaArgumentCount);
    for(size_t i = 0; i < pragmaArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at(gcFrame.pragmaNode->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.argumentNode, *environment);
        isLiteral = isLiteral && sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedArgument);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    if(isLiteral)
    {
        gcFrame.literalPragmaSelector = sysbvm_astLiteralNode_getValue(gcFrame.analyzedSelector);
        gcFrame.literalPragmaArguments = sysbvm_array_create(context, pragmaArgumentCount);
        for(size_t i = 0; i < pragmaArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.literalPragmaArguments, i, sysbvm_astLiteralNode_getValue(sysbvm_array_at(gcFrame.analyzedArguments, i)));
        
        gcFrame.literalPragma = sysbvm_pragma_create(context, gcFrame.literalPragmaSelector, gcFrame.literalPragmaArguments);
        gcFrame.literalPragmaNode = sysbvm_astLiteralNode_create(context, gcFrame.pragmaNode->super.sourcePosition, gcFrame.literalPragma);
        sysbvm_analysisEnvironment_addPragma(context, *environment, gcFrame.literalPragma);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)gcFrame.literalPragmaNode;
    }

    gcFrame.pragmaNode->arguments = gcFrame.analyzedArguments;
    gcFrame.pragmaNode->super.analyzedType = context->roots.pragmaType;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.pragmaNode;
}